

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta.cc
# Opt level: O2

dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *
tchecker::ta::sync_refclocks
          (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          system_t *system,reference_clock_variables_t *r,vedge_t *vedge)

{
  pointer local_70;
  const_iterator_t __begin2;
  const_iterator_t __end2;
  
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (__return_storage_ptr__,(ulong)r->_refcount,0,(allocator<unsigned_long> *)&__begin2);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::reset
            (__return_storage_ptr__);
  vedge_t::begin(&__begin2,vedge);
  vedge_t::end(&__end2,vedge);
  while (__begin2.super_type.m_iterator != __end2.super_type.m_iterator) {
    tchecker::system::edges_t::edge((edges_t *)&stack0xffffffffffffff90,(int)system + 0xb8);
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
              (__return_storage_ptr__,
               (ulong)(r->_procmap).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start
                      [*(uint *)&(local_70->
                                 super___shared_ptr<tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr],true);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffff98);
    boost::iterators::filter_iterator<bool_(*)(unsigned_int),_const_unsigned_int_*>::increment
              (&__begin2);
  }
  return __return_storage_ptr__;
}

Assistant:

boost::dynamic_bitset<> sync_refclocks(tchecker::ta::system_t const & system, tchecker::reference_clock_variables_t const & r,
                                       tchecker::vedge_t const & vedge)
{
  std::vector<tchecker::clock_id_t> const & procmap = r.procmap();
  boost::dynamic_bitset<> refclocks{r.refcount()};
  refclocks.reset();
  for (tchecker::edge_id_t id : vedge)
    refclocks.set(procmap[system.edge(id)->pid()]);
  return refclocks;
}